

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Z80Storage.cpp
# Opt level: O2

void __thiscall
CPU::Z80::ProcessorStorage::assemble_fetch_decode_execute
          (ProcessorStorage *this,InstructionPage *target,int length)

{
  RegisterPair16 *address;
  uint8_t *value;
  undefined4 *puVar1;
  undefined4 local_2f8 [2];
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  PartialMachineCycle local_2e0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  undefined8 uStack_2a8;
  PartialMachineCycle local_2a0;
  undefined4 local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  PartialMachineCycle local_260;
  undefined4 local_238;
  undefined8 local_230;
  undefined8 uStack_228;
  PartialMachineCycle local_220;
  undefined4 local_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  PartialMachineCycle local_1e0;
  undefined4 local_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  PartialMachineCycle local_1a0;
  undefined4 local_178 [2];
  undefined8 local_170;
  undefined8 uStack_168;
  PartialMachineCycle local_160;
  undefined4 local_138;
  undefined8 local_130;
  undefined8 uStack_128;
  PartialMachineCycle local_120;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  PartialMachineCycle PStack_e0;
  undefined4 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  PartialMachineCycle PStack_a0;
  undefined4 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  PartialMachineCycle PStack_60;
  
  local_2f8[0] = 0;
  address = &this->pc_;
  value = &this->operation_;
  local_2f0 = 0;
  uStack_2e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_2e0,ReadOpcodeStart,(HalfCycles)0x3,&address->full,value,false);
  local_2b8 = 0;
  local_2b0 = 0;
  uStack_2a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_2a0,ReadOpcodeWait,(HalfCycles)0x2,&address->full,value,true);
  local_278 = 0;
  local_270 = 0;
  uStack_268 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_260,ReadOpcode,(HalfCycles)0x1,&address->full,value,false);
  local_238 = 1;
  local_230 = 0;
  uStack_228 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_220);
  local_1f8 = 0;
  local_1f0 = 0;
  uStack_1e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_1e0,Refresh,(HalfCycles)0x4,&(this->refresh_addr_).full,(uint8_t *)0x0,false);
  local_1b8 = 2;
  local_1b0 = 0;
  uStack_1a8 = 0;
  PartialMachineCycle::PartialMachineCycle(&local_1a0);
  local_178[0] = 0;
  local_170 = 0;
  uStack_168 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_160,ReadStart,(HalfCycles)0x3,&address->full,value,false);
  local_138 = 0;
  local_130 = 0;
  uStack_128 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&local_120,ReadWait,(HalfCycles)0x2,&address->full,value,true);
  local_f8 = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_e0,Read,(HalfCycles)0x3,&address->full,value,false);
  local_b8 = 0;
  local_b0 = 0;
  uStack_a8 = 0;
  PartialMachineCycle::PartialMachineCycle
            (&PStack_a0,Internal,(HalfCycles)0x4,&this->last_address_bus_,(uint8_t *)0x0,false);
  local_78 = 2;
  local_70 = 0;
  uStack_68 = 0;
  PartialMachineCycle::PartialMachineCycle(&PStack_60);
  puVar1 = local_2f8;
  if (length != 4) {
    puVar1 = local_178;
  }
  (*this->_vptr_ProcessorStorage[1])(this,puVar1,&target->fetch_decode_execute);
  target->fetch_decode_execute_data =
       (target->fetch_decode_execute).
       super__Vector_base<CPU::Z80::ProcessorStorage::MicroOp,_std::allocator<CPU::Z80::ProcessorStorage::MicroOp>_>
       ._M_impl.super__Vector_impl_data._M_start;
  return;
}

Assistant:

void ProcessorStorage::assemble_fetch_decode_execute(InstructionPage &target, int length) {
	/// The fetch-decode-execute sequence for a regular four-clock M1 cycle.
	const MicroOp normal_fetch_decode_execute[] = {
		BusOp(ReadOpcodeStart()),
		BusOp(ReadOpcodeWait(true)),
		BusOp(ReadOpcodeEnd()),
		{ MicroOp::IncrementR },
		BusOp(Refresh()),
		{ MicroOp::DecodeOperation }
	};

	/// The concluding fetch-decode-execute of a [dd/fd]cb nn oo sequence, i.e. an (IX+n) or (IY+n) operation.
	/// Per the observed 48kb/128kb Spectrum timings, this appears not to include a refresh cycle. So I've also
	/// taken a punt on it not incrementing R.
	const MicroOp short_fetch_decode_execute[] = {
		BusOp(ReadStart(pc_, operation_)),
		BusOp(ReadWait(pc_, operation_)),
		BusOp(ReadEnd(pc_, operation_)),
		InternalOperation(4),
		{ MicroOp::DecodeOperation },
	};

	copy_program((length == 4) ? normal_fetch_decode_execute : short_fetch_decode_execute, target.fetch_decode_execute);
	target.fetch_decode_execute_data = target.fetch_decode_execute.data();
}